

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_glyph_outline.cpp
# Opt level: O1

ON_Outline * __thiscall ON_OutlineAccumulator::HarvestOutline(ON_OutlineAccumulator *this)

{
  ON_Outline *pOVar1;
  
  pOVar1 = *(ON_Outline **)(this + 0x50);
  *(undefined8 *)(this + 0x50) = 0;
  if (pOVar1 == *(ON_Outline **)(this + 0x58)) {
    *(undefined8 *)(this + 0x58) = 0;
  }
  Clear(this);
  return pOVar1;
}

Assistant:

ON_Outline* ON_OutlineAccumulator::HarvestOutline()
{  
  ON_Outline* outline = m_outline;
  m_outline = nullptr;
  if (outline == m_managed_outline)
    m_managed_outline = nullptr;
  Clear();
  return outline;
}